

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_parse_address(char *str,socket_address *sa,int *proto,char *host,size_t host_len)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ushort **ppuVar5;
  int iVar6;
  uint port;
  int len;
  uint d;
  uint c;
  uint b;
  uint a;
  
  port = 0;
  len = 0;
  *(undefined8 *)sa = 0;
  ((char *)((long)sa + 2))[6] = '\0';
  ((char *)((long)sa + 2))[7] = '\0';
  ((char *)((long)sa + 2))[8] = '\0';
  ((char *)((long)sa + 2))[9] = '\0';
  ((char *)((long)sa + 2))[10] = '\0';
  ((char *)((long)sa + 2))[0xb] = '\0';
  ((char *)((long)sa + 2))[0xc] = '\0';
  ((char *)((long)sa + 2))[0xd] = '\0';
  (sa->sa).sa_family = 2;
  *proto = 1;
  iVar2 = strncmp(str,"udp://",6);
  if (iVar2 == 0) {
    *proto = 2;
    str = str + 6;
  }
  else {
    iVar2 = strncmp(str,"tcp://",6);
    if (iVar2 == 0) {
      str = str + 6;
    }
  }
  iVar2 = __isoc99_sscanf(str,"%u.%u.%u.%u:%u%n",&a,&b,&c,&d,&port,&len);
  if (iVar2 == 5) {
    uVar3 = c << 8 | b << 0x10 | a << 0x18 | d;
    (sa->sin).sin_addr.s_addr =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | d << 0x18;
  }
  else {
    sVar4 = strlen(str);
    if ((sVar4 < 200) && (iVar2 = __isoc99_sscanf(str,"%[^ :]:%u%n",host,&port,&len), iVar2 == 2)) {
      (sa->sin).sin_port = (ushort)port << 8 | (ushort)port >> 8;
      iVar2 = mg_resolve_from_hosts_file(host,sa);
      if (iVar2 != 0) {
        return 0;
      }
      goto LAB_0010abbf;
    }
    iVar2 = __isoc99_sscanf(str,":%u%n",&port,&len);
    if ((iVar2 != 1) && (iVar2 = __isoc99_sscanf(str,"%u%n",&port,&len), iVar2 != 1)) {
      return -1;
    }
  }
  (sa->sin).sin_port = (ushort)port << 8 | (ushort)port >> 8;
LAB_0010abbf:
  iVar2 = len;
  iVar6 = -1;
  if (port < 0xffff) {
    cVar1 = str[len];
    if (((cVar1 == '\0') || (cVar1 == ',')) ||
       (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0)) {
      iVar6 = iVar2;
    }
  }
  return iVar6;
}

Assistant:

MG_INTERNAL int mg_parse_address(const char *str, union socket_address *sa,
                                 int *proto, char *host, size_t host_len) {
    unsigned int a, b, c, d, port = 0;
    int ch, len = 0;
#ifdef MG_ENABLE_IPV6
    char buf[100];
#endif

    /*
   * MacOS needs that. If we do not zero it, subsequent bind() will fail.
   * Also, all-zeroes in the socket address means binding to all addresses
   * for both IPv4 and IPv6 (INADDR_ANY and IN6ADDR_ANY_INIT).
   */
    memset(sa, 0, sizeof(*sa));
    sa->sin.sin_family = AF_INET;

    *proto = SOCK_STREAM;

    if (strncmp(str, "udp://", 6) == 0) {
        str += 6;
        *proto = SOCK_DGRAM;
    } else if (strncmp(str, "tcp://", 6) == 0) {
        str += 6;
    }

    if (sscanf(str, "%u.%u.%u.%u:%u%n", &a, &b, &c, &d, &port, &len) == 5) {
        /* Bind to a specific IPv4 address, e.g. 192.168.1.5:8080 */
        sa->sin.sin_addr.s_addr =
                htonl(((uint32_t) a << 24) | ((uint32_t) b << 16) | c << 8 | d);
        sa->sin.sin_port = htons((uint16_t) port);
#ifdef MG_ENABLE_IPV6
                                                                                                                                } else if (sscanf(str, "[%99[^]]]:%u%n", buf, &port, &len) == 2 &&
             inet_pton(AF_INET6, buf, &sa->sin6.sin6_addr)) {
    /* IPv6 address, e.g. [3ffe:2a00:100:7031::1]:8080 */
    sa->sin6.sin6_family = AF_INET6;
    sa->sin.sin_port = htons((uint16_t) port);
#endif
#ifndef MG_DISABLE_RESOLVER
    } else if (strlen(str) < host_len &&
               sscanf(str, "%[^ :]:%u%n", host, &port, &len) == 2) {
        sa->sin.sin_port = htons((uint16_t) port);
        if (mg_resolve_from_hosts_file(host, sa) != 0) {
            return 0;
        }
#endif
    } else if (sscanf(str, ":%u%n", &port, &len) == 1 ||
               sscanf(str, "%u%n", &port, &len) == 1) {
        /* If only port is specified, bind to IPv4, INADDR_ANY */
        sa->sin.sin_port = htons((uint16_t) port);
    } else {
        return -1;
    }

    ch = str[len]; /* Character that follows the address */
    return port < 0xffffUL && (ch == '\0' || ch == ',' || isspace(ch)) ? len : -1;
}